

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
::_remove_last(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
               *this,Index lastIndex)

{
  Dictionary *this_00;
  size_t *psVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  pointer puVar4;
  const_iterator __it;
  void *pvVar5;
  pointer puVar6;
  mapped_type *pmVar7;
  __node_base_ptr p_Var8;
  node_ptr plVar9;
  invalid_argument *this_01;
  pointer puVar10;
  long lVar11;
  const_node_ptr p;
  ulong uVar12;
  node_ptr plVar13;
  uint uVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  _Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>,_false>
  __it_00;
  ID_index pivot;
  uint local_2c;
  key_type local_28;
  uint local_24;
  
  uVar2 = (this->matrix_)._M_h._M_bucket_count;
  uVar12 = (ulong)lastIndex % uVar2;
  p_Var15 = (this->matrix_)._M_h._M_buckets[uVar12];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var15->_M_nxt, p_Var16 = p_Var15, *(Index *)&p_Var15->_M_nxt[1]._M_nxt != lastIndex
     )) {
    while (p_Var15 = p_Var3, p_Var3 = p_Var15->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar12) ||
         (p_Var16 = p_Var15, *(uint *)&p_Var3[1]._M_nxt == lastIndex)) goto LAB_00165a2e;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_00165a2e:
  if (p_Var16 == (__node_base_ptr)0x0) {
    __it_00._M_cur = (__node_type *)0x0;
  }
  else {
    __it_00._M_cur = (__node_type *)p_Var16->_M_nxt;
  }
  local_2c = *(uint *)((long)__it_00._M_cur + 0x24);
  puVar4 = (this->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4[*(uint *)((long)__it_00._M_cur + 0x20)] =
       puVar4[*(uint *)((long)__it_00._M_cur + 0x20)] - 1;
  puVar6 = (this->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar4 != puVar6 && (puVar10 = puVar6 + -1, *puVar10 == 0))) {
    (this->super_Matrix_dimension_option).dimensions_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar10;
    puVar6 = puVar10;
  }
  (this->super_Matrix_dimension_option).maxDim_ =
       (int)((ulong)((long)puVar6 - (long)puVar4) >> 2) + -1;
  if (*(key_type *)((long)__it_00._M_cur + 0x28) != 0xffffffff) {
    local_28 = *(key_type *)((long)__it_00._M_cur + 0x28);
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->matrix_,&local_28);
    (pmVar7->super_Chain_column_option).pairedColumn_ = 0xffffffff;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->pivotToColumnIndex_)._M_h,&local_2c);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->matrix_)._M_h,(const_iterator)__it_00._M_cur);
  this->nextIndex_ = this->nextIndex_ - 1;
  this_00 = &(this->super_Chain_pairing_option).indexToBar_;
  uVar14 = (this->super_Chain_pairing_option).nextPosition_ - 1;
  (this->super_Chain_pairing_option).nextPosition_ = uVar14;
  p_Var8 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,
                      (ulong)uVar14 %
                      (this->super_Chain_pairing_option).indexToBar_._M_h._M_bucket_count,
                      &(this->super_Chain_pairing_option).nextPosition_,(ulong)uVar14);
  __it.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
             )p_Var8->_M_nxt;
  pvVar5 = *(void **)((long)__it.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                            ._M_cur + 0x10);
  if (*(int *)((long)pvVar5 + 0x18) == -1) {
    psVar1 = &(this->super_Chain_pairing_option).barcode_.
              super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar5,0x20);
  }
  else {
    *(undefined4 *)((long)pvVar5 + 0x18) = 0xffffffff;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&this_00->_M_h,__it);
  local_24 = local_2c;
  plVar9 = (node_ptr)
           std::
           map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           ::at((this->super_Matrix_row_access_option).rows_,&local_24);
  lVar11 = 1;
  plVar13 = plVar9;
  do {
    plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
    lVar11 = lVar11 + -1;
  } while (plVar13 != plVar9);
  if (lVar11 == 0) {
    Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
    ::erase_empty_row(&this->super_Matrix_row_access_option,local_2c);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_01,
             "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."
            );
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline void Chain_matrix<Master_matrix>::_remove_last(Index lastIndex)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'_remove_last' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container || !Master_matrix::Option_list::has_vine_update,
                "'_remove_last' is not implemented for the chosen options.");

  ID_index pivot;

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto itToErase = matrix_.find(lastIndex);
    Column& colToErase = itToErase->second;
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_.erase(pivot);
    matrix_.erase(itToErase);
  } else {
    GUDHI_CHECK(lastIndex == nextIndex_ - 1 && nextIndex_ == matrix_.size(),
                std::logic_error("Chain_matrix::_remove_last - Indexation problem."));

    Column& colToErase = matrix_[lastIndex];
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_[pivot] = Master_matrix::template get_null_value<Index>();
    matrix_.pop_back();
    // TODO: resize matrix_ when a lot is removed? Could be not the best strategy if user inserts a lot back afterwards.
  }

  if constexpr (!Master_matrix::Option_list::has_vine_update) {
    --nextIndex_;  // should not be updated when there are vine updates, as possibly lastIndex != nextIndex - 1
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    auto it = _indexToBar().find(--_nextPosition());
    typename Barcode::iterator bar = it->second;

    if (bar->death == Master_matrix::template get_null_value<Pos_index>())
      _barcode().erase(bar);
    else
      bar->death = Master_matrix::template get_null_value<Pos_index>();

    _indexToBar().erase(it);
    if constexpr (Master_matrix::Option_list::has_vine_update) Swap_opt::CP::pivotToPosition_.erase(pivot);
  }

  if constexpr (Master_matrix::Option_list::has_row_access) {
    GUDHI_CHECK(
        RA_opt::get_row(pivot).size() == 0,
        std::invalid_argument(
            "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."));
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      RA_opt::erase_empty_row(pivot);
    }
  }
}